

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledPixel.cxx
# Opt level: O2

void __thiscall SSD1306::OledPixel::setFrom(OledPixel *this,OledPixel *pixels,OledPoint offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int x;
  int iVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar10 = 0;
  iVar6 = offset.m_x;
  uVar5 = 0;
  if (0 < iVar6) {
    uVar5 = (ulong)offset & 0xffffffff;
  }
  iVar2 = (*this->_vptr_OledPixel[8])();
  iVar3 = (*pixels->_vptr_OledPixel[8])(pixels);
  iVar1 = iVar3 + iVar6;
  if (iVar2 <= iVar3 + iVar6) {
    iVar1 = iVar2;
  }
  uVar9 = offset.m_y;
  if (uVar9 != 0 && -1 < (long)offset) {
    uVar10 = (ulong)uVar9;
  }
  iVar3 = (*this->_vptr_OledPixel[9])(this);
  iVar4 = (*pixels->_vptr_OledPixel[9])(pixels);
  iVar2 = iVar4 + uVar9;
  if (iVar3 <= (int)(iVar4 + uVar9)) {
    iVar2 = iVar3;
  }
  lVar8 = uVar10 << 0x20;
  for (; (long)uVar10 < (long)iVar2; uVar10 = uVar10 + 1) {
    for (uVar7 = uVar5; (long)uVar7 < (long)iVar1; uVar7 = uVar7 + 1) {
      iVar3 = (*pixels->_vptr_OledPixel[4])(pixels,CONCAT44((int)uVar10 - uVar9,(int)uVar7 - iVar6))
      ;
      (*this->_vptr_OledPixel[(ulong)(byte)((byte)iVar3 ^ 1) + 5])(this,uVar7 + lVar8);
    }
    lVar8 = lVar8 + 0x100000000;
  }
  return;
}

Assistant:

void
SSD1306::OledPixel::setFrom(
    const OledPixel& pixels,
    SSD1306::OledPoint offset)
{
    auto xStart = std::max(0, offset.x());
    auto xEnd = std::min(width(), pixels.width() + offset.x());
    auto yStart = std::max(0, offset.y());
    auto yEnd = std::min(height(), pixels.height() + offset.y());

    for (auto y = yStart ; y < yEnd ; ++y)
    {
        for (auto x = xStart ; x < xEnd ; ++x)
        {
            OledPoint inputP{x - offset.x(), y - offset.y()};
            OledPoint outputP{x, y};

            if (pixels.isSetPixel(inputP))
            {
                setPixel(outputP);
            }
            else
            {
                unsetPixel(outputP);
            }
        }
    }
}